

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

int xmlPythonFileReadRaw(void *context,char *buffer,int len)

{
  int in_EAX;
  uint uVar1;
  int iVar2;
  PyObject *op;
  void *__src;
  size_t __n;
  Py_ssize_t size;
  
  iVar2 = -1;
  if (context == (void *)0x0) {
    return -1;
  }
  size._0_4_ = in_EAX;
  op = (PyObject *)_PyObject_CallMethod_SizeT(context,"read","(i)",len);
  if (op == (PyObject *)0x0) {
    puts("xmlPythonFileReadRaw: result is NULL");
    return -1;
  }
  uVar1 = (uint)op->ob_type->tp_flags;
  if ((uVar1 >> 0x1b & 1) == 0) {
    if ((uVar1 >> 0x1c & 1) == 0) {
      puts("xmlPythonFileReadRaw: result is not a String");
      goto LAB_0013b5ea;
    }
    __src = (void *)PyUnicode_AsUTF8AndSize(op,&size);
    iVar2 = (int)size;
  }
  else {
    iVar2 = PyBytes_Size(op);
    __src = (void *)PyBytes_AsString(op);
  }
  __n = (long)len;
  if (iVar2 <= len) {
    __n = (long)iVar2;
  }
  memcpy(buffer,__src,__n);
LAB_0013b5ea:
  _Py_DECREF(op);
  return iVar2;
}

Assistant:

static int
xmlPythonFileReadRaw (void * context, char * buffer, int len) {
    PyObject *file;
    PyObject *ret;
    int lenread = -1;
    char *data;

    file = (PyObject *) context;
    if (file == NULL) return(-1);
    ret = PyObject_CallMethod(file, (char *) "read", (char *) "(i)", len);
    if (ret == NULL) {
	printf("xmlPythonFileReadRaw: result is NULL\n");
	return(-1);
    } else if (PyBytes_Check(ret)) {
	lenread = PyBytes_Size(ret);
	data = PyBytes_AsString(ret);
#ifdef PyUnicode_Check
    } else if (PyUnicode_Check (ret)) {
#if PY_VERSION_HEX >= 0x03030000
        Py_ssize_t size;
	const char *tmp;

	/* tmp doesn't need to be deallocated */
        tmp = PyUnicode_AsUTF8AndSize(ret, &size);

	lenread = (int) size;
	data = (char *) tmp;
#else
        PyObject *b;
	b = PyUnicode_AsUTF8String(ret);
	if (b == NULL) {
	    printf("xmlPythonFileReadRaw: failed to convert to UTF-8\n");
	    return(-1);
	}
	lenread = PyBytes_Size(b);
	data = PyBytes_AsString(b);
	Py_DECREF(b);
#endif
#endif
    } else {
	printf("xmlPythonFileReadRaw: result is not a String\n");
	Py_DECREF(ret);
	return(-1);
    }
    if (lenread > len)
	memcpy(buffer, data, len);
    else
	memcpy(buffer, data, lenread);
    Py_DECREF(ret);
    return(lenread);
}